

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O3

char * __thiscall Potassco::ProgramOptions::Option::argName(Option *this)

{
  byte_t bVar1;
  Value *pVVar2;
  ValueDesc *pVVar3;
  char *pcVar4;
  
  pVVar2 = this->value_;
  bVar1 = pVVar2->descFlag_;
  if ((bVar1 == '\b') || (bVar1 == '\x01')) {
    if (bVar1 == '\x01') {
      pVVar3 = &pVVar2->desc_;
    }
    else {
      pVVar3 = (ValueDesc *)(pVVar2->desc_).pack;
    }
    if (pVVar3->value != (char *)0x0) {
      return pVVar3->value;
    }
  }
  pcVar4 = "<arg>";
  if ((~pVVar2->flags_ & 3) == 0) {
    pcVar4 = "";
  }
  return pcVar4;
}

Assistant:

const char*        argName()        const { return value_->arg(); }